

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

void __thiscall MotionInit::Print(MotionInit *this,ostream *out)

{
  ostream *poVar1;
  
  std::operator<<(out,"Init: v = ");
  poVar1 = std::ostream::_M_insert<double>((this->super_MotionBase).vf);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Print(std::ostream &out) const
    { out << "Init: v = " << vf << std::endl; }